

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

void cmFortranParser_RuleSubmoduleNested
               (cmFortranParser *parser,char *module_name,char *submodule_name,
               char *nested_submodule_name)

{
  long lVar1;
  string *__s;
  char *__s_00;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  string local_178;
  _Base_ptr local_158;
  undefined1 local_150;
  string local_148;
  allocator<char> local_121;
  string local_120;
  string local_100;
  string *local_e0;
  string *nest_name;
  string local_d0;
  string local_b0;
  string *local_90;
  string *sub_name;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string *local_30;
  string *mod_name;
  char *nested_submodule_name_local;
  char *submodule_name_local;
  char *module_name_local;
  cmFortranParser *parser_local;
  
  if (parser->InPPFalseBranch == 0) {
    mod_name = (string *)nested_submodule_name;
    nested_submodule_name_local = submodule_name;
    submodule_name_local = module_name;
    module_name_local = (char *)parser;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,module_name,&local_71);
    cmsys::SystemTools::LowerCase(&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    __s_00 = nested_submodule_name_local;
    local_30 = &local_50;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,__s_00,(allocator<char> *)((long)&nest_name + 7));
    cmsys::SystemTools::LowerCase(&local_b0,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&nest_name + 7));
    __s = mod_name;
    local_90 = &local_b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,(char *)__s,&local_121);
    cmsys::SystemTools::LowerCase(&local_100,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    local_e0 = &local_100;
    lVar1 = *(long *)(module_name_local + 0x1a0);
    cmFortranParser_s::SModName(&local_148,(cmFortranParser_s *)module_name_local,local_30,local_90)
    ;
    pVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(lVar1 + 0x50),&local_148);
    local_158 = (_Base_ptr)pVar2.first._M_node;
    local_150 = pVar2.second;
    std::__cxx11::string::~string((string *)&local_148);
    lVar1 = *(long *)(module_name_local + 0x1a0);
    cmFortranParser_s::SModName(&local_178,(cmFortranParser_s *)module_name_local,local_30,local_e0)
    ;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(lVar1 + 0x20),&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void cmFortranParser_RuleSubmoduleNested(cmFortranParser* parser,
                                         const char* module_name,
                                         const char* submodule_name,
                                         const char* nested_submodule_name)
{
  if (parser->InPPFalseBranch) {
    return;
  }

  // syntax:   "submodule (module_name:submodule_name) nested_submodule_name"
  // requires: "module_name@submodule_name.smod"
  // provides: "module_name@nested_submodule_name.smod"

  std::string const& mod_name = cmSystemTools::LowerCase(module_name);
  std::string const& sub_name = cmSystemTools::LowerCase(submodule_name);
  std::string const& nest_name =
    cmSystemTools::LowerCase(nested_submodule_name);
  parser->Info.Requires.insert(parser->SModName(mod_name, sub_name));
  parser->Info.Provides.insert(parser->SModName(mod_name, nest_name));
}